

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

void ucal_setAttribute_63(UCalendar *cal,UCalendarAttribute attr,int32_t newValue)

{
  int32_t newValue_local;
  UCalendarAttribute attr_local;
  UCalendar *cal_local;
  
  switch(attr) {
  case UCAL_LENIENT:
    icu_63::Calendar::setLenient((Calendar *)cal,(uint8_t)newValue);
    break;
  case UCAL_FIRST_DAY_OF_WEEK:
    icu_63::Calendar::setFirstDayOfWeek((Calendar *)cal,newValue);
    break;
  case UCAL_MINIMAL_DAYS_IN_FIRST_WEEK:
    icu_63::Calendar::setMinimalDaysInFirstWeek((Calendar *)cal,(uint8_t)newValue);
    break;
  case UCAL_REPEATED_WALL_TIME:
    icu_63::Calendar::setRepeatedWallTimeOption((Calendar *)cal,newValue);
    break;
  case UCAL_SKIPPED_WALL_TIME:
    icu_63::Calendar::setSkippedWallTimeOption((Calendar *)cal,newValue);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucal_setAttribute(      UCalendar*              cal,
                  UCalendarAttribute      attr,
                  int32_t                 newValue)
{

    switch(attr) {
  case UCAL_LENIENT:
      ((Calendar*)cal)->setLenient((UBool)newValue);
      break;

  case UCAL_FIRST_DAY_OF_WEEK:
      ((Calendar*)cal)->setFirstDayOfWeek((UCalendarDaysOfWeek)newValue);
      break;

  case UCAL_MINIMAL_DAYS_IN_FIRST_WEEK:
      ((Calendar*)cal)->setMinimalDaysInFirstWeek((uint8_t)newValue);
      break;

  case UCAL_REPEATED_WALL_TIME:
      ((Calendar*)cal)->setRepeatedWallTimeOption((UCalendarWallTimeOption)newValue);
      break;

  case UCAL_SKIPPED_WALL_TIME:
      ((Calendar*)cal)->setSkippedWallTimeOption((UCalendarWallTimeOption)newValue);
      break;
    }
}